

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O2

void drawBrace(ostream *out)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  string fill;
  string stroke;
  string local_50 [32];
  string local_30 [32];
  
  dVar2 = 2.5 / AspectRatio;
  std::__cxx11::string::string(local_50,(string *)&ClefColor_abi_cxx11_);
  std::__cxx11::string::string(local_30,(string *)&ClefColor_abi_cxx11_);
  if (bwQ != 0) {
    std::__cxx11::string::assign((char *)local_50);
  }
  dVar3 = StaffThickness * ClefFactor;
  std::operator<<(out,"<g transform=\"scale(");
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1,", 1)\">\n");
  std::operator<<(out,"\t<g class=\"brace\" transform=\"rotate(0.2) translate(");
  poVar1 = std::ostream::_M_insert<double>(30.5);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(-324.0);
  poVar1 = std::operator<<(poVar1,
                           ") scale(1,-1) scale(.0175)\">\n\t\t<path vector-effect=\"non-scaling-stroke\" stroke=\""
                          );
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,"\" fill=\"");
  poVar1 = std::operator<<(poVar1,local_50);
  std::operator<<(poVar1,"\" stroke-width=\"");
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar1,
                  "\" stroke-linejoin=\"round\" d=\"M-2031.812-22924.453\n\t\t\tc-24.919,88.91-36.494,171.418-39.024,279.09c-2.379,101.156,9.877,207.264,16.991,305.533\n\t\t\tc6.605,91.162,10.955,191.51-0.048,282.248c-2.757,22.732-8.614,43.227-13.597,63.254c-8.261,33.207-2.886,38.68,5.136,72.111\n\t\t\tc10.485,43.689,11.808,90.887,13.172,140.795c3.604,132-16.215,270.613-24.675,400.074\n\t\t\tc-8.818,134.883,3.651,255.861,34.113,366.164c-17.906-92.289-29.886-179.082-25.068-283.635\n\t\t\tc4.572-99.275,18.379-195.207,24.078-294.23c5.11-88.826,9.914-203.154-8.344-284.342c-4.91-21.82-10.217-42.227-15.835-62.98\n\t\t\tc-9.146-33.812-7.235-31.322,2.353-65.664c11.021-39.504,20.774-80.965,24.589-128.662c10.5-131.361-2.347-271.072-13.816-398.416\n\t\t\tc-5.957-66.148-10.878-134.006-7.34-202.238C-2055.575-22803.877-2044.086-22863.117-2031.812-22924.453L-2031.812-22924.453z\"/>\n\t</g>\n"
                 );
  std::operator<<(out,"</g>\n");
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void drawBrace(ostream& out) {
   double unscale = 2.5 / AspectRatio;
   string fill   = ClefColor;
   string stroke = ClefColor;
   if (bwQ) {
      fill   = "transparent";
   }
   double strokewidth = StaffThickness * ClefFactor;
   double xpos = 30.5;
   double ypos = -324;

   out << "<g transform=\"scale(" << unscale << ", 1)\">\n";

	out  <<
"	<g class=\"brace\" transform=\"rotate(0.2) translate(" << xpos << "," << ypos << ") scale(1,-1) scale(.0175)\">\n"
"		<path vector-effect=\"non-scaling-stroke\" stroke=\"" << stroke << "\" fill=\"" << fill << "\" stroke-width=\"" << strokewidth << "\" stroke-linejoin=\"round\" d=\"M-2031.812-22924.453\n"
"			c-24.919,88.91-36.494,171.418-39.024,279.09c-2.379,101.156,9.877,207.264,16.991,305.533\n"
"			c6.605,91.162,10.955,191.51-0.048,282.248c-2.757,22.732-8.614,43.227-13.597,63.254c-8.261,33.207-2.886,38.68,5.136,72.111\n"
"			c10.485,43.689,11.808,90.887,13.172,140.795c3.604,132-16.215,270.613-24.675,400.074\n"
"			c-8.818,134.883,3.651,255.861,34.113,366.164c-17.906-92.289-29.886-179.082-25.068-283.635\n"
"			c4.572-99.275,18.379-195.207,24.078-294.23c5.11-88.826,9.914-203.154-8.344-284.342c-4.91-21.82-10.217-42.227-15.835-62.98\n"
"			c-9.146-33.812-7.235-31.322,2.353-65.664c11.021-39.504,20.774-80.965,24.589-128.662c10.5-131.361-2.347-271.072-13.816-398.416\n"
"			c-5.957-66.148-10.878-134.006-7.34-202.238C-2055.575-22803.877-2044.086-22863.117-2031.812-22924.453L-2031.812-22924.453z\"/>\n"
"	</g>\n";

   out << "</g>\n";
}